

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

string * __thiscall
vkt::SpirVAssembly::getAsmTypeDeclaration_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,IntegerType type)

{
  char *pcVar1;
  IntegerType type_00;
  string sign;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  pcVar1 = "%type = OpTypeInt 32 0";
  if ((int)this < 3) {
    pcVar1 = "%type = OpTypeInt 32 1";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,pcVar1 + 0x14,(allocator<char> *)&local_70);
  getBitWidthStr_abi_cxx11_(&local_50,(SpirVAssembly *)((ulong)this & 0xffffffff),type_00);
  std::operator+(&local_70,"OpTypeInt ",&local_50);
  std::operator+(__return_storage_ptr__,&local_70,&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

const string getAsmTypeDeclaration (IntegerType type)
{
	string sign = isSigned(type) ? " 1" : " 0";
	return "OpTypeInt " + getBitWidthStr(type) + sign;
}